

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaParserCtxtPtr xmlSchemaParserCtxtCreate(void)

{
  xmlSchemaItemListPtr pxVar1;
  xmlSchemaParserCtxtPtr ret;
  
  ret = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x100);
  if (ret == (xmlSchemaParserCtxtPtr)0x0) {
    xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0);
    ret = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    memset(ret,0,0x100);
    ret->type = 1;
    pxVar1 = xmlSchemaItemListCreate();
    ret->attrProhibs = pxVar1;
    if (ret->attrProhibs == (xmlSchemaItemListPtr)0x0) {
      (*xmlFree)(ret);
      ret = (xmlSchemaParserCtxtPtr)0x0;
    }
  }
  return ret;
}

Assistant:

static xmlSchemaParserCtxtPtr
xmlSchemaParserCtxtCreate(void)
{
    xmlSchemaParserCtxtPtr ret;

    ret = (xmlSchemaParserCtxtPtr) xmlMalloc(sizeof(xmlSchemaParserCtxt));
    if (ret == NULL) {
        xmlSchemaPErrMemory(NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaParserCtxt));
    ret->type = XML_SCHEMA_CTXT_PARSER;
    ret->attrProhibs = xmlSchemaItemListCreate();
    if (ret->attrProhibs == NULL) {
	xmlFree(ret);
	return(NULL);
    }
    return(ret);
}